

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O1

void __thiscall
InsertProxyModel::setSourceModel(InsertProxyModel *this,QAbstractItemModel *newSourceModel)

{
  QVector<QMetaObject::Connection> *this_00;
  InsertProxyModelPrivate *pIVar1;
  int iVar2;
  int iVar3;
  QAbstractItemModel *pQVar4;
  long lVar5;
  void **ppvVar6;
  undefined4 *puVar7;
  long *plVar8;
  Connection *pCVar9;
  QMap<int,_QVariant> local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  Connection local_d0;
  Connection local_c8;
  Connection local_c0;
  Connection local_b8;
  Connection local_b0;
  Connection local_a8;
  Connection local_a0;
  Connection local_98;
  Connection local_90;
  Connection local_88;
  Connection local_80;
  Connection local_78;
  Connection local_70;
  Connection local_68;
  Connection local_60;
  Connection local_58;
  Connection local_50;
  code *local_48;
  ImplFn local_40;
  Connection local_38;
  
  pQVar4 = (QAbstractItemModel *)QAbstractProxyModel::sourceModel();
  if (pQVar4 != newSourceModel) {
    pIVar1 = this->m_dptr;
    QAbstractItemModel::beginResetModel();
    lVar5 = QAbstractProxyModel::sourceModel();
    if ((lVar5 != 0) && ((pIVar1->m_sourceConnections).d.size != 0)) {
      pCVar9 = (pIVar1->m_sourceConnections).d.ptr;
      do {
        QObject::disconnect(pCVar9);
        pCVar9 = pCVar9 + 1;
      } while (pCVar9 != (pIVar1->m_sourceConnections).d.ptr + (pIVar1->m_sourceConnections).d.size)
      ;
    }
    QAbstractProxyModel::setSourceModel((QAbstractItemModel *)this);
    this_00 = &pIVar1->m_sourceConnections;
    QList<QMetaObject::Connection>::clear(this_00);
    lVar5 = 0x68;
    do {
      QList<QMap<int,_QVariant>_>::clear
                ((QList<QMap<int,_QVariant>_> *)((long)pIVar1->m_extraData + lVar5 + -0x68));
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x98);
    lVar5 = QAbstractProxyModel::sourceModel();
    if (lVar5 != 0) {
      ppvVar6 = (void **)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QObject::destroyed;
      local_e0 = 0;
      puVar7 = (undefined4 *)operator_new(0x18);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:268:84),_0,_QtPrivate::List<>,_void>
           ::impl;
      *(InsertProxyModel **)(puVar7 + 4) = this;
      QObject::connectImpl
                ((QObject *)&local_38,ppvVar6,(QObject *)&local_e8,ppvVar6,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar7,(int *)0x1,(QMetaObject *)0x0);
      QtPrivate::QGenericArrayOps<QMetaObject::Connection>::emplace<QMetaObject::Connection>
                ((QGenericArrayOps<QMetaObject::Connection> *)this_00,
                 (pIVar1->m_sourceConnections).d.size,&local_38);
      ppvVar6 = (void **)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::dataChanged;
      local_e0 = 0;
      puVar7 = (undefined4 *)operator_new(0x18);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:270:37),_3,_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&,_const_QList<int>_&>,_void>
           ::impl;
      *(InsertProxyModel **)(puVar7 + 4) = this;
      QObject::connectImpl
                ((QObject *)&local_50,ppvVar6,(QObject *)&local_e8,ppvVar6,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar7,(int *)0x1,(QMetaObject *)0x0);
      QtPrivate::QGenericArrayOps<QMetaObject::Connection>::emplace<QMetaObject::Connection>
                ((QGenericArrayOps<QMetaObject::Connection> *)this_00,
                 (pIVar1->m_sourceConnections).d.size,&local_50);
      ppvVar6 = (void **)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::headerDataChanged;
      local_e0 = 0;
      local_48 = QAbstractItemModel::headerDataChanged;
      local_40 = (ImplFn)0x0;
      puVar7 = (undefined4 *)operator_new(0x20);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QSlotObject<void_(QAbstractItemModel::*)(Qt::Orientation,_int,_int),_QtPrivate::List<Qt::Orientation,_int,_int>,_void>
           ::impl;
      *(code **)(puVar7 + 4) = QAbstractItemModel::headerDataChanged;
      *(undefined8 *)(puVar7 + 6) = 0;
      QObject::connectImpl
                ((QObject *)&local_58,ppvVar6,(QObject *)&local_e8,(void **)this,
                 (QSlotObjectBase *)&local_48,(ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
      QtPrivate::QGenericArrayOps<QMetaObject::Connection>::emplace<QMetaObject::Connection>
                ((QGenericArrayOps<QMetaObject::Connection> *)this_00,
                 (pIVar1->m_sourceConnections).d.size,&local_58);
      ppvVar6 = (void **)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::layoutAboutToBeChanged;
      local_e0 = 0;
      puVar7 = (undefined4 *)operator_new(0x18);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:275:37),_2,_QtPrivate::List<const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint>,_void>
           ::impl;
      *(InsertProxyModelPrivate **)(puVar7 + 4) = pIVar1;
      QObject::connectImpl
                ((QObject *)&local_48,ppvVar6,(QObject *)&local_e8,ppvVar6,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar7,(int *)0x1,(QMetaObject *)0x0);
      QtPrivate::QGenericArrayOps<QMetaObject::Connection>::emplace<QMetaObject::Connection>
                ((QGenericArrayOps<QMetaObject::Connection> *)this_00,
                 (pIVar1->m_sourceConnections).d.size,(Connection *)&local_48);
      ppvVar6 = (void **)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::layoutChanged;
      local_e0 = 0;
      puVar7 = (undefined4 *)operator_new(0x18);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:279:37),_2,_QtPrivate::List<const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint>,_void>
           ::impl;
      *(InsertProxyModelPrivate **)(puVar7 + 4) = pIVar1;
      QObject::connectImpl
                ((QObject *)&local_60,ppvVar6,(QObject *)&local_e8,ppvVar6,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar7,(int *)0x1,(QMetaObject *)0x0);
      QtPrivate::QGenericArrayOps<QMetaObject::Connection>::emplace<QMetaObject::Connection>
                ((QGenericArrayOps<QMetaObject::Connection> *)this_00,
                 (pIVar1->m_sourceConnections).d.size,&local_60);
      ppvVar6 = (void **)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::columnsAboutToBeInserted;
      local_e0 = 0;
      puVar7 = (undefined4 *)operator_new(0x18);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:283:37),_3,_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(InsertProxyModel **)(puVar7 + 4) = this;
      QObject::connectImpl
                ((QObject *)&local_68,ppvVar6,(QObject *)&local_e8,ppvVar6,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar7,(int *)0x1,(QMetaObject *)0x0);
      QtPrivate::QGenericArrayOps<QMetaObject::Connection>::emplace<QMetaObject::Connection>
                ((QGenericArrayOps<QMetaObject::Connection> *)this_00,
                 (pIVar1->m_sourceConnections).d.size,&local_68);
      ppvVar6 = (void **)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::columnsAboutToBeMoved;
      local_e0 = 0;
      puVar7 = (undefined4 *)operator_new(0x18);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:289:37),_5,_QtPrivate::List<const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int>,_void>
           ::impl;
      *(InsertProxyModel **)(puVar7 + 4) = this;
      QObject::connectImpl
                ((QObject *)&local_70,ppvVar6,(QObject *)&local_e8,ppvVar6,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar7,(int *)0x1,(QMetaObject *)0x0);
      QtPrivate::QGenericArrayOps<QMetaObject::Connection>::emplace<QMetaObject::Connection>
                ((QGenericArrayOps<QMetaObject::Connection> *)this_00,
                 (pIVar1->m_sourceConnections).d.size,&local_70);
      ppvVar6 = (void **)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::columnsAboutToBeRemoved;
      local_e0 = 0;
      puVar7 = (undefined4 *)operator_new(0x18);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:299:37),_3,_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(InsertProxyModel **)(puVar7 + 4) = this;
      QObject::connectImpl
                ((QObject *)&local_78,ppvVar6,(QObject *)&local_e8,ppvVar6,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar7,(int *)0x1,(QMetaObject *)0x0);
      QtPrivate::QGenericArrayOps<QMetaObject::Connection>::emplace<QMetaObject::Connection>
                ((QGenericArrayOps<QMetaObject::Connection> *)this_00,
                 (pIVar1->m_sourceConnections).d.size,&local_78);
      ppvVar6 = (void **)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::columnsInserted;
      local_e0 = 0;
      puVar7 = (undefined4 *)operator_new(0x18);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:305:37),_3,_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(InsertProxyModelPrivate **)(puVar7 + 4) = pIVar1;
      QObject::connectImpl
                ((QObject *)&local_80,ppvVar6,(QObject *)&local_e8,ppvVar6,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar7,(int *)0x1,(QMetaObject *)0x0);
      QtPrivate::QGenericArrayOps<QMetaObject::Connection>::emplace<QMetaObject::Connection>
                ((QGenericArrayOps<QMetaObject::Connection> *)this_00,
                 (pIVar1->m_sourceConnections).d.size,&local_80);
      ppvVar6 = (void **)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::columnsRemoved;
      local_e0 = 0;
      puVar7 = (undefined4 *)operator_new(0x18);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:307:37),_3,_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(InsertProxyModelPrivate **)(puVar7 + 4) = pIVar1;
      QObject::connectImpl
                ((QObject *)&local_88,ppvVar6,(QObject *)&local_e8,ppvVar6,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar7,(int *)0x1,(QMetaObject *)0x0);
      QtPrivate::QGenericArrayOps<QMetaObject::Connection>::emplace<QMetaObject::Connection>
                ((QGenericArrayOps<QMetaObject::Connection> *)this_00,
                 (pIVar1->m_sourceConnections).d.size,&local_88);
      ppvVar6 = (void **)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::columnsMoved;
      local_e0 = 0;
      puVar7 = (undefined4 *)operator_new(0x18);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:309:37),_5,_QtPrivate::List<const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int>,_void>
           ::impl;
      *(InsertProxyModelPrivate **)(puVar7 + 4) = pIVar1;
      QObject::connectImpl
                ((QObject *)&local_90,ppvVar6,(QObject *)&local_e8,ppvVar6,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar7,(int *)0x1,(QMetaObject *)0x0);
      QtPrivate::QGenericArrayOps<QMetaObject::Connection>::emplace<QMetaObject::Connection>
                ((QGenericArrayOps<QMetaObject::Connection> *)this_00,
                 (pIVar1->m_sourceConnections).d.size,&local_90);
      ppvVar6 = (void **)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::rowsAboutToBeInserted;
      local_e0 = 0;
      puVar7 = (undefined4 *)operator_new(0x18);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:313:37),_3,_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(InsertProxyModel **)(puVar7 + 4) = this;
      QObject::connectImpl
                ((QObject *)&local_98,ppvVar6,(QObject *)&local_e8,ppvVar6,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar7,(int *)0x1,(QMetaObject *)0x0);
      QtPrivate::QGenericArrayOps<QMetaObject::Connection>::emplace<QMetaObject::Connection>
                ((QGenericArrayOps<QMetaObject::Connection> *)this_00,
                 (pIVar1->m_sourceConnections).d.size,&local_98);
      ppvVar6 = (void **)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::rowsAboutToBeMoved;
      local_e0 = 0;
      puVar7 = (undefined4 *)operator_new(0x18);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:319:37),_5,_QtPrivate::List<const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int>,_void>
           ::impl;
      *(InsertProxyModel **)(puVar7 + 4) = this;
      QObject::connectImpl
                ((QObject *)&local_a0,ppvVar6,(QObject *)&local_e8,ppvVar6,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar7,(int *)0x1,(QMetaObject *)0x0);
      QtPrivate::QGenericArrayOps<QMetaObject::Connection>::emplace<QMetaObject::Connection>
                ((QGenericArrayOps<QMetaObject::Connection> *)this_00,
                 (pIVar1->m_sourceConnections).d.size,&local_a0);
      ppvVar6 = (void **)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::rowsAboutToBeRemoved;
      local_e0 = 0;
      puVar7 = (undefined4 *)operator_new(0x18);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:329:37),_3,_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(InsertProxyModel **)(puVar7 + 4) = this;
      QObject::connectImpl
                ((QObject *)&local_a8,ppvVar6,(QObject *)&local_e8,ppvVar6,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar7,(int *)0x1,(QMetaObject *)0x0);
      QtPrivate::QGenericArrayOps<QMetaObject::Connection>::emplace<QMetaObject::Connection>
                ((QGenericArrayOps<QMetaObject::Connection> *)this_00,
                 (pIVar1->m_sourceConnections).d.size,&local_a8);
      ppvVar6 = (void **)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::rowsInserted;
      local_e0 = 0;
      puVar7 = (undefined4 *)operator_new(0x18);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:335:37),_3,_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(InsertProxyModelPrivate **)(puVar7 + 4) = pIVar1;
      QObject::connectImpl
                ((QObject *)&local_b0,ppvVar6,(QObject *)&local_e8,ppvVar6,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar7,(int *)0x1,(QMetaObject *)0x0);
      QtPrivate::QGenericArrayOps<QMetaObject::Connection>::emplace<QMetaObject::Connection>
                ((QGenericArrayOps<QMetaObject::Connection> *)this_00,
                 (pIVar1->m_sourceConnections).d.size,&local_b0);
      ppvVar6 = (void **)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::rowsRemoved;
      local_e0 = 0;
      puVar7 = (undefined4 *)operator_new(0x18);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:337:37),_3,_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(InsertProxyModelPrivate **)(puVar7 + 4) = pIVar1;
      QObject::connectImpl
                ((QObject *)&local_b8,ppvVar6,(QObject *)&local_e8,ppvVar6,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar7,(int *)0x1,(QMetaObject *)0x0);
      QtPrivate::QGenericArrayOps<QMetaObject::Connection>::emplace<QMetaObject::Connection>
                ((QGenericArrayOps<QMetaObject::Connection> *)this_00,
                 (pIVar1->m_sourceConnections).d.size,&local_b8);
      ppvVar6 = (void **)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::rowsMoved;
      local_e0 = 0;
      puVar7 = (undefined4 *)operator_new(0x18);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:339:37),_5,_QtPrivate::List<const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int>,_void>
           ::impl;
      *(InsertProxyModelPrivate **)(puVar7 + 4) = pIVar1;
      QObject::connectImpl
                ((QObject *)&local_c0,ppvVar6,(QObject *)&local_e8,ppvVar6,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar7,(int *)0x1,(QMetaObject *)0x0);
      QtPrivate::QGenericArrayOps<QMetaObject::Connection>::emplace<QMetaObject::Connection>
                ((QGenericArrayOps<QMetaObject::Connection> *)this_00,
                 (pIVar1->m_sourceConnections).d.size,&local_c0);
      ppvVar6 = (void **)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::modelAboutToBeReset;
      local_e0 = 0;
      puVar7 = (undefined4 *)operator_new(0x18);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:342:94),_0,_QtPrivate::List<>,_void>
           ::impl;
      *(InsertProxyModel **)(puVar7 + 4) = this;
      QObject::connectImpl
                ((QObject *)&local_c8,ppvVar6,(QObject *)&local_e8,ppvVar6,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar7,(int *)0x1,(QMetaObject *)0x0);
      QtPrivate::QGenericArrayOps<QMetaObject::Connection>::emplace<QMetaObject::Connection>
                ((QGenericArrayOps<QMetaObject::Connection> *)this_00,
                 (pIVar1->m_sourceConnections).d.size,&local_c8);
      ppvVar6 = (void **)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )QAbstractItemModel::modelReset;
      local_e0 = 0;
      puVar7 = (undefined4 *)operator_new(0x18);
      *puVar7 = 1;
      *(code **)(puVar7 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:343:85),_0,_QtPrivate::List<>,_void>
           ::impl;
      *(InsertProxyModelPrivate **)(puVar7 + 4) = pIVar1;
      QObject::connectImpl
                ((QObject *)&local_d0,ppvVar6,(QObject *)&local_e8,ppvVar6,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar7,(int *)0x1,(QMetaObject *)0x0);
      QtPrivate::QGenericArrayOps<QMetaObject::Connection>::emplace<QMetaObject::Connection>
                ((QGenericArrayOps<QMetaObject::Connection> *)this_00,
                 (pIVar1->m_sourceConnections).d.size,&local_d0);
      QMetaObject::Connection::~Connection(&local_d0);
      QMetaObject::Connection::~Connection(&local_c8);
      QMetaObject::Connection::~Connection(&local_c0);
      QMetaObject::Connection::~Connection(&local_b8);
      QMetaObject::Connection::~Connection(&local_b0);
      QMetaObject::Connection::~Connection(&local_a8);
      QMetaObject::Connection::~Connection(&local_a0);
      QMetaObject::Connection::~Connection(&local_98);
      QMetaObject::Connection::~Connection(&local_90);
      QMetaObject::Connection::~Connection(&local_88);
      QMetaObject::Connection::~Connection(&local_80);
      QMetaObject::Connection::~Connection(&local_78);
      QMetaObject::Connection::~Connection(&local_70);
      QMetaObject::Connection::~Connection(&local_68);
      QMetaObject::Connection::~Connection(&local_60);
      QMetaObject::Connection::~Connection((Connection *)&local_48);
      QMetaObject::Connection::~Connection(&local_58);
      QMetaObject::Connection::~Connection(&local_50);
      QMetaObject::Connection::~Connection(&local_38);
      plVar8 = (long *)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                        *)0xffffffffffffffff;
      local_e0 = 0;
      uStack_d8 = 0;
      iVar2 = (**(code **)(*plVar8 + 0x80))(plVar8,&local_e8);
      plVar8 = (long *)QAbstractProxyModel::sourceModel();
      local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                        *)0xffffffffffffffff;
      local_e0 = 0;
      uStack_d8 = 0;
      iVar3 = (**(code **)(*plVar8 + 0x78))(plVar8,&local_e8);
      if (0 < iVar3) {
        do {
          local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                          )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                            *)0x0;
          QtPrivate::QMovableArrayOps<QMap<int,QVariant>>::emplace<QMap<int,QVariant>>
                    ((QMovableArrayOps<QMap<int,QVariant>> *)pIVar1->m_extraData,
                     pIVar1->m_extraData[0].d.size,&local_e8);
          QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          ::~QExplicitlySharedDataPointerV2(&local_e8.d);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      if (0 < iVar2) {
        do {
          local_e8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                          )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                            *)0x0;
          QtPrivate::QMovableArrayOps<QMap<int,QVariant>>::emplace<QMap<int,QVariant>>
                    ((QMovableArrayOps<QMap<int,QVariant>> *)(pIVar1->m_extraData + 1),
                     pIVar1->m_extraData[1].d.size,&local_e8);
          QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          ::~QExplicitlySharedDataPointerV2(&local_e8.d);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
    }
    QAbstractItemModel::endResetModel();
  }
  return;
}

Assistant:

void InsertProxyModel::setSourceModel(QAbstractItemModel *newSourceModel)
{
    if (newSourceModel == sourceModel())
        return;
    Q_D(InsertProxyModel);
    beginResetModel();
    if (sourceModel()) {
        for (auto discIter = d->m_sourceConnections.cbegin(); discIter != d->m_sourceConnections.cend(); ++discIter)
            QObject::disconnect(*discIter);
    }
    QAbstractProxyModel::setSourceModel(newSourceModel);
    d->m_sourceConnections.clear();
    for (auto &extraData : d->m_extraData)
        extraData.clear();
    if (sourceModel()) {
        d->m_sourceConnections
                << QObject::connect(sourceModel(), &QAbstractItemModel::destroyed, [this]() -> void { setSourceModel(Q_NULLPTR); })
                << QObject::connect(sourceModel(), &QAbstractItemModel::dataChanged,
                                    [this](const QModelIndex &topLeft, const QModelIndex &bottomRight, const QVector<int> &roles) {
                                        Q_EMIT dataChanged(mapFromSource(topLeft), mapFromSource(bottomRight), roles);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::headerDataChanged, this, &QAbstractItemModel::headerDataChanged)
                << QObject::connect(sourceModel(), &QAbstractItemModel::layoutAboutToBeChanged,
                                    [d](const QList<QPersistentModelIndex> &parents, QAbstractItemModel::LayoutChangeHint hint) {
                                        d->beforeLayoutChange(parents, hint);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::layoutChanged,
                                    [d](const QList<QPersistentModelIndex> &parents, QAbstractItemModel::LayoutChangeHint hint) {
                                        d->afetrLayoutChange(parents, hint);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::columnsAboutToBeInserted,
                                    [this](const QModelIndex &parent, int first, int last) {
                                        if (!parent.isValid()) {
                                            beginInsertColumns(QModelIndex(), first, last);
                                        }
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::columnsAboutToBeMoved,
                                    [this](const QModelIndex &sourceParent, int sourceStart, int sourceEnd, const QModelIndex &destinationParent,
                                           int destinationColumn) {
                                        if (sourceParent.isValid())
                                            return;
                                        if (destinationParent.isValid())
                                            beginRemoveColumns(QModelIndex(), sourceStart, sourceEnd);
                                        else
                                            beginMoveColumns(QModelIndex(), sourceStart, sourceEnd, QModelIndex(), destinationColumn);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::columnsAboutToBeRemoved,
                                    [this](const QModelIndex &parent, int first, int last) {
                                        if (!parent.isValid()) {
                                            beginRemoveColumns(QModelIndex(), first, last);
                                        }
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::columnsInserted,
                                    [d](const QModelIndex &parent, int first, int last) -> void { d->onColumnsInserted(parent, first, last); })
                << QObject::connect(sourceModel(), &QAbstractItemModel::columnsRemoved,
                                    [d](const QModelIndex &parent, int first, int last) -> void { d->onColumnsRemoved(parent, first, last); })
                << QObject::connect(sourceModel(), &QAbstractItemModel::columnsMoved,
                                    [d](const QModelIndex &parent, int start, int end, const QModelIndex &destination, int column) -> void {
                                        d->onColumnsMoved(parent, start, end, destination, column);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::rowsAboutToBeInserted,
                                    [this](const QModelIndex &parent, int first, int last) {
                                        if (!parent.isValid()) {
                                            beginInsertRows(QModelIndex(), first, last);
                                        }
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::rowsAboutToBeMoved,
                                    [this](const QModelIndex &sourceParent, int sourceStart, int sourceEnd, const QModelIndex &destinationParent,
                                           int destinationRow) {
                                        if (sourceParent.isValid())
                                            return;
                                        if (destinationParent.isValid())
                                            beginRemoveRows(QModelIndex(), sourceStart, sourceEnd);
                                        else
                                            beginMoveRows(QModelIndex(), sourceStart, sourceEnd, QModelIndex(), destinationRow);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::rowsAboutToBeRemoved,
                                    [this](const QModelIndex &parent, int first, int last) {
                                        if (!parent.isValid()) {
                                            beginRemoveRows(QModelIndex(), first, last);
                                        }
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::rowsInserted,
                                    [d](const QModelIndex &parent, int first, int last) -> void { d->onRowsInserted(parent, first, last); })
                << QObject::connect(sourceModel(), &QAbstractItemModel::rowsRemoved,
                                    [d](const QModelIndex &parent, int first, int last) -> void { d->onRowsRemoved(parent, first, last); })
                << QObject::connect(sourceModel(), &QAbstractItemModel::rowsMoved,
                                    [d](const QModelIndex &parent, int start, int end, const QModelIndex &destination, int row) -> void {
                                        d->onRowsMoved(parent, start, end, destination, row);
                                    })
                << QObject::connect(sourceModel(), &QAbstractItemModel::modelAboutToBeReset, [this]() -> void { beginResetModel(); })
                << QObject::connect(sourceModel(), &QAbstractItemModel::modelReset, [d]() -> void { d->afterReset(); });
        const int sourceCols = sourceModel()->columnCount();
        const int sourceRows = sourceModel()->rowCount();
        for (int i = 0; i < sourceRows; ++i)
            d->m_extraData[0].append(RolesContainer());
        for (int i = 0; i < sourceCols; ++i)
            d->m_extraData[1].append(RolesContainer());
    }

    endResetModel();
}